

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer.cc
# Opt level: O0

void prometheus::anon_unknown_5::SerializeUntyped
               (ostream *out,MetricFamily *family,ClientMetric *metric)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  ClientMetric *local_20;
  ClientMetric *metric_local;
  MetricFamily *family_local;
  ostream *out_local;
  
  local_20 = metric;
  metric_local = (ClientMetric *)family;
  family_local = (MetricFamily *)out;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"",&local_79);
  std::__cxx11::string::string((string *)&local_a0);
  (anonymous_namespace)::WriteHead<std::__cxx11::string>
            (out,family,metric,&local_40,&local_78,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  WriteValue((ostream *)family_local,(local_20->untyped).value);
  WriteTail((ostream *)family_local,local_20);
  return;
}

Assistant:

void SerializeUntyped(std::ostream& out, const MetricFamily& family,
                      const ClientMetric& metric) {
  WriteHead(out, family, metric);
  WriteValue(out, metric.untyped.value);
  WriteTail(out, metric);
}